

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O1

cpp_regex_traits<char> * __thiscall
boost::xpressive::cpp_regex_traits<char>::imbue(cpp_regex_traits<char> *this,locale_type *loc)

{
  locale *this_00;
  ctype *pcVar1;
  locale *in_RDX;
  
  this_00 = loc + 0x200;
  std::locale::locale((locale *)this,this_00);
  std::locale::operator=(this_00,in_RDX);
  pcVar1 = std::use_facet<std::ctype<char>>(this_00);
  *(ctype **)(loc + 0x208) = pcVar1;
  detail::cpp_regex_traits_base<char,_1UL>::imbue((cpp_regex_traits_base<char,_1UL> *)loc,this_00);
  return this;
}

Assistant:

locale_type imbue(locale_type loc)
    {
        locale_type old_loc = this->loc_;
        this->loc_ = loc;
        this->ctype_ = &BOOST_USE_FACET(std::ctype<char_type>, this->loc_);
        //this->collate_ = &BOOST_USE_FACET(std::collate<char_type>, this->loc_);
        this->base_type::imbue(this->loc_);
        return old_loc;
    }